

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O3

bool __thiscall HEkkDual::newDevexFramework(HEkkDual *this,double updated_edge_weight)

{
  int iVar1;
  int iVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  auVar4._8_8_ = this->computed_edge_weight;
  auVar4._0_8_ = updated_edge_weight;
  auVar5._8_4_ = SUB84(updated_edge_weight,0);
  auVar5._0_8_ = this->computed_edge_weight;
  auVar5._12_4_ = (int)((ulong)updated_edge_weight >> 0x20);
  auVar5 = divpd(auVar4,auVar5);
  iVar1 = (int)((double)this->solver_num_row / 0.01);
  iVar2 = 0x19;
  if (0x19 < iVar1) {
    iVar2 = iVar1;
  }
  dVar3 = auVar5._8_8_;
  if (auVar5._8_8_ <= auVar5._0_8_) {
    dVar3 = auVar5._0_8_;
  }
  return iVar2 < this->num_devex_iterations || 9.0 < dVar3;
}

Assistant:

bool HEkkDual::newDevexFramework(const double updated_edge_weight) {
  // Analyse the Devex weight to determine whether a new framework
  // should be set up
  //
  // There is a new Devex framework if either
  //
  // 1) The weight inaccuracy ratio exceeds kMaxAllowedDevexWeightRatio
  //
  // 2) There have been max(kMinAbsNumberDevexIterations,
  // numRow/kMinRlvNumberDevexIterations) Devex iterations
  //
  const HighsInt kMinAbsNumberDevexIterations = 25;
  const double kMinRlvNumberDevexIterations = 1e-2;
  const double kMaxAllowedDevexWeightRatio = 3.0;

  double devex_ratio = max(updated_edge_weight / computed_edge_weight,
                           computed_edge_weight / updated_edge_weight);
  HighsInt i_te = solver_num_row / kMinRlvNumberDevexIterations;
  i_te = max(kMinAbsNumberDevexIterations, i_te);
  // Square kMaxAllowedDevexWeightRatio due to keeping squared
  // weights
  const double accept_ratio_threshold =
      kMaxAllowedDevexWeightRatio * kMaxAllowedDevexWeightRatio;
  const bool accept_ratio = devex_ratio <= accept_ratio_threshold;
  const bool accept_it = num_devex_iterations <= i_te;
  bool return_new_devex_framework;
  return_new_devex_framework = !accept_ratio || !accept_it;
  return return_new_devex_framework;
}